

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miscellaneous.cpp
# Opt level: O0

bool __thiscall chatra::WaitContext::save(WaitContext *this,Writer *w)

{
  Writer *w_local;
  WaitContext *this_local;
  
  Writer::out<unsigned_int,_nullptr>(w,this->waitingId);
  Writer::out<unsigned_long,_nullptr>(w,this->callerFrame);
  Writer::
  out<std::vector<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>,_std::allocator<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_chatra_lang[P]chatra_chatra_core_Miscellaneous_cpp:165:17),_nullptr>
            (w,&this->targets,(anon_class_8_1_54a39817)w);
  Writer::out<unsigned_long,_nullptr>(w,this->remainingCount);
  return false;
}

Assistant:

bool WaitContext::save(Writer& w) const {
	w.out(waitingId);
	w.out(callerFrame);
	w.out(targets, [&](const std::unique_ptr<Target>& target) {
		w.out(target->index);
		w.out(target->key);
	});
	w.out(remainingCount);

	return false;
}